

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_chroma_mode_19_to_25
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int in_ECX;
  int iVar5;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  WORD32 ref_idx;
  WORD32 ref_main_idx_v;
  WORD32 ref_main_idx_u;
  WORD32 fract;
  WORD32 pos;
  WORD32 inv_ang_sum;
  WORD32 inv_ang;
  WORD32 idx;
  WORD32 intra_pred_ang;
  WORD32 k;
  WORD32 col;
  WORD32 row;
  byte local_d8 [96];
  UWORD8 *ref_main;
  int local_40;
  int local_3c;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  long local_18;
  long local_8;
  
  local_34 = gai4_ihevc_ang_table_chroma[in_R9D];
  local_3c = gai4_ihevc_inv_ang_table_chroma[in_R9D + -0xc];
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_30 = 0; SBORROW4(local_30,(local_20 + 1) * 2) != local_30 + (local_20 + 1) * -2 < 0;
      local_30 = local_30 + 2) {
    local_d8[local_30 + (local_20 + -1) * 2] = *(byte *)(local_8 + (local_20 * 4 + local_30));
    local_d8[local_30 + 1 + (local_20 + -1) * 2] =
         *(byte *)(local_8 + (local_20 * 4 + local_30 + 1));
  }
  iVar2 = local_20 * local_34 >> 5;
  local_40 = 0x80;
  lVar1 = (long)((local_20 + -1) * 2) + -0xd8;
  for (local_30 = -2; iVar5 = iVar2 * 2,
      local_30 != iVar5 && SBORROW4(local_30,iVar5) == local_30 + iVar2 * -2 < 0;
      local_30 = local_30 + -2) {
    local_40 = local_3c + local_40;
    local_d8[local_30 + lVar1 + 0xd8] = *(byte *)(local_8 + (local_20 * 4 + (local_40 >> 8) * -2));
    local_d8[(local_30 + 1) + lVar1 + 0xd8] =
         *(byte *)(local_8 + (local_20 * 4 + 1 + (local_40 >> 8) * -2));
  }
  for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
    uVar3 = (local_28 + 1) * local_34;
    iVar2 = (int)uVar3 >> 5;
    uVar3 = uVar3 & 0x1f;
    for (local_2c = 0; SBORROW4(local_2c,local_20 * 2) != local_2c + local_20 * -2 < 0;
        local_2c = local_2c + 2) {
      iVar5 = local_2c + iVar2 * 2;
      iVar4 = local_2c + iVar2 * 2;
      *(char *)(local_18 + (local_28 * local_1c + local_2c)) =
           (char)((int)((0x20 - uVar3) * (uint)local_d8[(iVar5 + 2) + lVar1 + 0xd8] +
                        uVar3 * local_d8[(iVar5 + 4) + lVar1 + 0xd8] + 0x10) >> 5);
      *(char *)(local_18 + (local_28 * local_1c + local_2c + 1)) =
           (char)((int)((0x20 - uVar3) * (uint)local_d8[(iVar4 + 3) + lVar1 + 0xd8] +
                        uVar3 * local_d8[(iVar4 + 5) + lVar1 + 0xd8] + 0x10) >> 5);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_19_to_25(UWORD8 *pu1_ref,
                                           WORD32 src_strd,
                                           UWORD8 *pu1_dst,
                                           WORD32 dst_strd,
                                           WORD32 nt,
                                           WORD32 mode)
{

    WORD32 row, col, k;
    WORD32 intra_pred_ang, idx;
    WORD32 inv_ang, inv_ang_sum, pos, fract;
    WORD32 ref_main_idx_u, ref_main_idx_v, ref_idx;
    UWORD8 ref_temp[(2 * MAX_CU_SIZE) + 2];
    UWORD8 *ref_main;
    UNUSED(src_strd);


    intra_pred_ang = gai4_ihevc_ang_table_chroma[mode];
    inv_ang = gai4_ihevc_inv_ang_table_chroma[mode - 12];

    /* Intermediate reference samples for negative angle modes */
    /* This have to be removed during optimization*/
    /* For horizontal modes, (ref main = ref above) (ref side = ref left) */
    ref_main = ref_temp + 2 * nt;
    for(k = 0; k < (2 * (nt + 1)); k += 2)
    {
        ref_temp[k + (2 * (nt - 1))] = pu1_ref[(4 * nt) + k];
        ref_temp[k + 1 + (2 * (nt - 1))] = pu1_ref[(4 * nt) + k + 1];
    }


    ref_idx = (nt * intra_pred_ang) >> 5;
    inv_ang_sum = 128;
    ref_main = ref_temp + (2 * (nt - 1));
    /* SIMD Optimization can be done using look-up table for the loop */
    /* For negative angled derive the main reference samples from side */
    /*  reference samples refer to section 8.4.4.2.6 */
    for(k = -2; k > (2 * ref_idx); k -= 2)
    {
        inv_ang_sum += inv_ang;
        ref_main[k] = pu1_ref[(4 * nt) - (inv_ang_sum >> 8) * 2];
        ref_main[k + 1] = pu1_ref[((4 * nt) + 1) - (inv_ang_sum >> 8) * 2];
    }

    for(row = 0; row < nt; row++)
    {
        pos = ((row + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);

        // Do linear filtering
        for(col = 0; col < (2 * nt); col += 2)
        {
            ref_main_idx_u = col + 2 * idx + 2;
            ref_main_idx_v = (col + 1) + 2 * idx + 2;
            pu1_dst[(row * dst_strd) + col] = (UWORD8)(((32 - fract)
                            * ref_main[ref_main_idx_u]
                            + fract * ref_main[ref_main_idx_u + 2] + 16) >> 5);
            pu1_dst[(row * dst_strd) + (col + 1)] = (UWORD8)(((32 - fract)
                            * ref_main[ref_main_idx_v]
                            + fract * ref_main[ref_main_idx_v + 2] + 16) >> 5);

        }

    }

}